

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::PopAndCheck1Type(TypeChecker *this,Type expected,char *desc)

{
  bool bVar1;
  Result RVar2;
  Result RVar3;
  Type actual;
  Type local_30;
  
  local_30.enum_ = Any;
  local_30.type_index_ = 0;
  RVar2 = PeekType(this,0,&local_30);
  bVar1 = RVar2.enum_ == Error ||
          local_30 != expected && (local_30.enum_ != Any && expected.enum_ != Any);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar1;
  PrintStackIfFailed<wabt::Type>(this,RVar2,desc,expected);
  RVar2 = DropTypes(this,1);
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar1 || RVar2.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck1Type(Type expected, const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected);
  PrintStackIfFailed(result, desc, expected);
  result |= DropTypes(1);
  return result;
}